

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxBitOp::Resolve(FxBitOp *this,FCompileContext *ctx)

{
  BYTE BVar1;
  FxExpression *pFVar2;
  FxExpression *pFVar3;
  PType *pPVar4;
  PString *pPVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxConstant *this_00;
  uint uVar9;
  FScriptPosition *pFVar10;
  uint uVar11;
  FString local_28;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar2 = (this->super_FxBinary).left;
  if (pFVar2 != (FxExpression *)0x0) {
    iVar8 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar8);
  }
  pFVar2 = (this->super_FxBinary).right;
  if (pFVar2 != (FxExpression *)0x0) {
    iVar8 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar8);
  }
  pFVar2 = (this->super_FxBinary).left;
  if ((pFVar2 == (FxExpression *)0x0) ||
     (pFVar3 = (this->super_FxBinary).right, pFVar3 == (FxExpression *)0x0)) {
    this_00 = (FxConstant *)0x0;
  }
  else {
    pPVar4 = pFVar2->ValueType;
    if ((pPVar4 == (PType *)TypeBool) && (pFVar3->ValueType == (PType *)TypeBool)) {
      (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
    }
    else {
      cVar6 = (**(code **)(*(long *)&pPVar4->super_PTypeBase + 0x40))();
      if ((cVar6 == '\0') ||
         (iVar8 = (*(((this->super_FxBinary).right)->ValueType->super_PTypeBase).super_DObject.
                    _vptr_DObject[8])(), (char)iVar8 == '\0')) {
        this_00 = (FxConstant *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                   "Incompatible operands for bit operation");
        goto LAB_0052bb90;
      }
      bVar7 = FxBinary::Promote(&this->super_FxBinary,ctx,true);
      if (!bVar7) {
        return (FxExpression *)0x0;
      }
    }
    iVar8 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
    if ((char)iVar8 == '\0') {
      return (FxExpression *)this;
    }
    iVar8 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
    if ((char)iVar8 == '\0') {
      return (FxExpression *)this;
    }
    pFVar2 = (this->super_FxBinary).left;
    pPVar5 = (PString *)pFVar2[1]._vptr_FxExpression;
    pFVar10 = &pFVar2[1].ScriptPosition;
    if (pPVar5 == TypeString) {
      FString::AttachToOther(&local_28,&pFVar10->FileName);
    }
    else {
      local_28.Chars = (pFVar10->FileName).Chars;
    }
    BVar1 = (pPVar5->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar11 = (uint)(double)local_28.Chars;
    }
    else {
      uVar11 = 0;
      if (BVar1 == '\0') {
        uVar11 = (uint)local_28.Chars;
      }
    }
    if (pPVar5 == TypeString) {
      FString::~FString(&local_28);
    }
    pFVar2 = (this->super_FxBinary).right;
    pPVar5 = (PString *)pFVar2[1]._vptr_FxExpression;
    pFVar10 = &pFVar2[1].ScriptPosition;
    if (pPVar5 == TypeString) {
      FString::AttachToOther(&local_28,&pFVar10->FileName);
    }
    else {
      local_28.Chars = (pFVar10->FileName).Chars;
    }
    BVar1 = (pPVar5->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar9 = (uint)(double)local_28.Chars;
    }
    else {
      uVar9 = 0;
      if (BVar1 == '\0') {
        uVar9 = (uint)local_28.Chars;
      }
    }
    if (pPVar5 == TypeString) {
      FString::~FString(&local_28);
    }
    this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    iVar8 = (this->super_FxBinary).Operator;
    if (iVar8 == 0x7c) {
      uVar9 = uVar9 | uVar11;
    }
    else if (iVar8 == 0x26) {
      uVar9 = uVar9 & uVar11;
    }
    else {
      uVar9 = uVar9 ^ uVar11;
      if (iVar8 != 0x5e) {
        uVar9 = 0;
      }
    }
    FxConstant::FxConstant(this_00,uVar9,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
  }
LAB_0052bb90:
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxBitOp::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for bit operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == '&'? v1 & v2 : 
			Operator == '|'? v1 | v2 : 
			Operator == '^'? v1 ^ v2 : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}